

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_input.cpp
# Opt level: O0

bool exit_if_stop_char(Am_Input_Char ic)

{
  bool bVar1;
  Am_Input_Char local_10 [2];
  Am_Input_Char ic_local;
  
  local_10[0] = ic;
  bVar1 = Am_Input_Char::operator==(local_10,Am_Stop_Character);
  if (bVar1) {
    Am_Main_Loop_Go = false;
  }
  return bVar1;
}

Assistant:

bool
exit_if_stop_char(Am_Input_Char ic)
{
  if (ic == Am_Stop_Character) {
    //   std::cerr << "Got stop event: exiting Amulet main loop." <<std::endl;
    Am_Main_Loop_Go = false;
    return true;
  } else
    return false;
}